

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O2

void __thiscall
dynet::FastLSTMBuilder::FastLSTMBuilder
          (FastLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  Parameter PVar4;
  Parameter PVar5;
  Parameter PVar6;
  Parameter PVar7;
  Parameter PVar8;
  Parameter PVar9;
  Parameter PVar10;
  Parameter PVar11;
  Parameter PVar12;
  Parameter PVar13;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<dynet::Parameter> __l;
  allocator_type local_1a1;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  Parameter local_e0;
  Parameter local_d0;
  Parameter local_c0;
  Parameter local_b0;
  Parameter local_a0;
  Parameter local_90;
  Parameter local_80;
  Parameter local_70;
  Parameter local_60;
  Parameter local_50;
  Parameter local_40;
  
  (this->super_RNNBuilder).cur.t = -1;
  (this->super_RNNBuilder).sm.q_ = CREATED;
  (this->super_RNNBuilder).head.
  super__Vector_base<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder).head.
  super__Vector_base<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RNNBuilder).head.
  super__Vector_base<dynet::RNNPointer,_std::allocator<dynet::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar3 = ZEXT464(0) << 0x40;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__FastLSTMBuilder_006ab378;
  this->params = (vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                  )auVar3._0_24_;
  this->param_vars =
       (vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
        )auVar3._24_24_;
  (this->h).
  super__Vector_base<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar3._48_8_;
  (this->h).
  super__Vector_base<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar3._56_8_;
  *(undefined1 (*) [64])
   &(this->param_vars).
    super__Vector_base<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar3;
  auVar2 = ZEXT832(0) << 0x20;
  this->h0 = (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>)
             auVar2._0_24_;
  (this->c0).super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   &(this->h0).super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar2;
  this->layers = layers;
  while (bVar1 = layers != 0, layers = layers - 1, bVar1) {
    x._M_len = 2;
    x._M_array = (iterator)
                 &ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = input_dim;
    Dim::Dim((Dim *)&local_e0,x);
    PVar4 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    x_00._M_len = 2;
    x_00._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_e0,x_00);
    PVar5 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 1;
    x_01._M_len = 2;
    x_01._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_e0,x_01);
    PVar6 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    x_02._M_len = 1;
    x_02._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_e0,x_02);
    PVar7 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    x_03._M_len = 2;
    x_03._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = input_dim;
    Dim::Dim((Dim *)&local_e0,x_03);
    PVar8 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    x_04._M_len = 2;
    x_04._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_e0,x_04);
    PVar9 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 1;
    x_05._M_len = 2;
    x_05._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_e0,x_05);
    PVar10 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    x_06._M_len = 1;
    x_06._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_e0,x_06);
    PVar11 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    x_07._M_len = 2;
    x_07._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = input_dim;
    Dim::Dim((Dim *)&local_e0,x_07);
    PVar12 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    x_08._M_len = 2;
    x_08._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_e0,x_08);
    PVar13 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    x_09._M_len = 1;
    x_09._M_array =
         (iterator)&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_e0,x_09);
    local_40 = Model::add_parameters(model,(Dim *)&local_e0,0.0);
    __l._M_len = 0xb;
    __l._M_array = (iterator)&local_e0;
    local_50 = PVar13;
    local_e0 = PVar4;
    local_d0 = PVar5;
    local_c0 = PVar6;
    local_b0 = PVar7;
    local_a0 = PVar8;
    local_90 = PVar9;
    local_80 = PVar10;
    local_70 = PVar11;
    local_60 = PVar12;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)
               &ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>,__l,
               &local_1a1);
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back(&this->params,
                (value_type *)
                &ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>);
    std::_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~_Vector_base
              (&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>);
    input_dim = hidden_dim;
  }
  return;
}

Assistant:

FastLSTMBuilder::FastLSTMBuilder(unsigned layers,
                                 unsigned input_dim,
                                 unsigned hidden_dim,
                                 Model& model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameter p_x2i = model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2i = model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2i = model.add_parameters({hidden_dim, 1});
    Parameter p_bi = model.add_parameters({hidden_dim});

    // o
    Parameter p_x2o = model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2o = model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2o = model.add_parameters({hidden_dim, 1});
    Parameter p_bo = model.add_parameters({hidden_dim});

    // c
    Parameter p_x2c = model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2c = model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bc = model.add_parameters({hidden_dim});
    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
}